

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O1

void __thiscall t_html_generator::print_doc(t_html_generator *this,t_doc *tdoc)

{
  ofstream_with_content_based_conditional_update *poVar1;
  ostream *poVar2;
  string local_40;
  
  if (tdoc->has_doc_ == true) {
    poVar1 = &this->f_out_;
    if (this->unsafe_ == true) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(tdoc->doc_)._M_dataplus._M_p,
                          (tdoc->doc_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<br/>",5);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<pre>",5);
    escape_html(&local_40,this,&tdoc->doc_);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</pre><br/>",0xb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void t_html_generator::print_doc(t_doc* tdoc) {
  if (tdoc->has_doc()) {
    if (unsafe_) {
      f_out_ << tdoc->get_doc() << "<br/>";
    } else {
      f_out_ << "<pre>" << escape_html(tdoc->get_doc()) << "</pre><br/>";
    }
  }
}